

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::add_packed_varint<short_const*>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,short *first,short *last)

{
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sw;
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  if (first != last) {
    local_38.m_data = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
    local_38.m_rollback_pos = 0;
    local_38.m_pos = 0;
    local_38.m_parent_writer =
         (basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this;
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::open_submessage((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,tag,0);
    for (; first != last; first = first + 1) {
      basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::add_varint(&local_38,(long)*first);
    }
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~basic_pbf_writer(&local_38);
  }
  return;
}

Assistant:

void add_packed_varint(pbf_tag_type tag, It first, It last) { // NOLINT(performance-unnecessary-value-param)
        if (first == last) {
            return;
        }

        basic_pbf_writer sw{*this, tag};

        while (first != last) {
            sw.add_varint(uint64_t(*first++));
        }
    }